

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5IndexMergeLevel(Fts5Index *p,Fts5Structure **ppStruct,int iLvl,int *pnRem)

{
  int *piVar1;
  sqlite3_stmt **ppStmt;
  Fts5Buffer *pBuf;
  ushort uVar2;
  uint nSegment;
  u32 nData;
  u8 *pData;
  Fts5StructureSegment *pFVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ulong iRowid;
  int iVar6;
  int iVar7;
  int iVar8;
  char *zSql;
  long lVar9;
  Fts5Data *p_00;
  uint uVar10;
  Fts5StructureLevel *pFVar11;
  Fts5Structure *pStruct;
  ulong uVar12;
  long lVar13;
  Fts5Iter *pFVar14;
  int in_R8D;
  Fts5SegIter *pFVar15;
  int iLvl_00;
  bool bVar16;
  Fts5StructureSegment *local_130;
  Fts5Buffer local_108;
  ulong local_f8;
  undefined4 local_f0;
  int local_ec;
  Fts5Structure *local_e8;
  Fts5Iter *pIter;
  int *local_d8;
  u8 local_cc [4];
  Fts5Buffer local_c8;
  Fts5StructureLevel *local_b0;
  Fts5SegWriter writer;
  
  pStruct = *ppStruct;
  pFVar11 = pStruct->aLevel + iLvl;
  pIter = (Fts5Iter *)0x0;
  if (pnRem == (int *)0x0) {
    local_ec = 0;
  }
  else {
    local_ec = *pnRem;
  }
  iVar6 = p->pConfig->eDetail;
  writer.btterm.p = (u8 *)0x0;
  writer.btterm.n = 0;
  writer.btterm.nSpace = 0;
  writer.nEmpty = 0;
  writer.nDlidx = 0;
  writer.aDlidx = (Fts5DlidxWriter *)0x0;
  writer.iPrevRowid = 0;
  writer.bFirstRowidInDoclist = '\0';
  writer.bFirstRowidInPage = '\0';
  writer.bFirstTermInPage = '\0';
  writer._75_1_ = 0;
  writer.nLeafWritten = 0;
  writer.writer.term.p = (u8 *)0x0;
  writer.writer.term.n = 0;
  writer.writer.term.nSpace = 0;
  writer.writer.pgidx.p = (u8 *)0x0;
  writer.writer.pgidx.n = 0;
  writer.writer.pgidx.nSpace = 0;
  writer.writer.buf.p = (u8 *)0x0;
  writer.writer.buf.n = 0;
  writer.writer.buf.nSpace = 0;
  writer.iSegid = 0;
  writer._4_4_ = 0;
  writer.writer.pgno = 0;
  writer.writer.iPrevPgidx = 0;
  writer.iBtPage = 0;
  writer._116_4_ = 0;
  local_c8.p = (u8 *)0x0;
  local_c8.n = 0;
  local_c8.nSpace = 0;
  nSegment = pFVar11->nMerge;
  local_d8 = pnRem;
  if (nSegment == 0) {
    iVar7 = fts5AllocateSegid(p,pStruct);
    if (pStruct->nLevel + -1 == iLvl) {
      fts5StructureAddLevel(&p->rc,ppStruct);
      pStruct = *ppStruct;
    }
    iLvl_00 = iLvl + 1;
    fts5StructureExtendLevel(&p->rc,pStruct,iLvl_00,0,in_R8D);
    if (p->rc != 0) {
      return;
    }
    pFVar11 = pStruct->aLevel + iLvl;
    fts5WriteInit(p,&writer,iVar7);
    iVar8 = pStruct->aLevel[iLvl_00].nSeg;
    local_130 = pStruct->aLevel[iLvl_00].aSeg + iVar8;
    iVar8 = iVar8 + 1;
    pStruct->aLevel[iLvl_00].nSeg = iVar8;
    local_130->pgnoFirst = 1;
    local_130->iSegid = iVar7;
    pStruct->nSegment = pStruct->nSegment + 1;
    nSegment = pStruct->aLevel[iLvl].nSeg;
    local_e8 = pStruct;
    local_b0 = pStruct->aLevel + iLvl_00;
  }
  else {
    local_130 = (Fts5StructureSegment *)
                (*(long *)(pStruct[1].aLevel + (long)iLvl + -1) + -0xc +
                (long)*(int *)((long)&pStruct[1].aLevel[(long)iLvl + -2].aSeg + 4) * 0xc);
    local_e8 = pStruct;
    fts5WriteInit(p,&writer,local_130->iSegid);
    writer.writer.pgno = local_130->pgnoLast + 1;
    writer._112_8_ = writer._112_8_ & 0xffffffff00000000;
    iVar8 = *(int *)((long)&pStruct[1].aLevel[(long)iLvl + -2].aSeg + 4);
    local_b0 = (Fts5StructureLevel *)&pStruct[1].aLevel[(long)iLvl + -2].aSeg;
  }
  if (iVar8 == 1) {
    local_f0 = CONCAT31((int3)((uint)(iLvl + 2) >> 8),local_e8->nLevel == iLvl + 2);
  }
  else {
    local_f0 = 0;
  }
  fts5MultiIterNew(p,local_e8,0x20,(Fts5Colset *)0x0,(u8 *)0x0,0,iLvl,nSegment,&pIter);
  pFVar14 = pIter;
  piVar1 = &p->rc;
  if (p->rc == 0) {
    local_f8 = local_f8 & 0xffffffff00000000;
    do {
      if ((pFVar14->base).bEof != '\0') break;
      uVar2 = pFVar14->aFirst[1].iFirst;
      nData = pFVar14->aSeg[uVar2].term.n;
      pData = pFVar14->aSeg[uVar2].term.p;
      if ((nData != local_c8.n) ||
         ((nData != 0 && (iVar7 = bcmp(pData,local_c8.p,(long)(int)nData), iVar7 != 0)))) {
        if ((local_d8 != (int *)0x0) && (local_ec < writer.nLeafWritten)) break;
        local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
        sqlite3Fts5BufferAppendBlob(piVar1,&local_c8,nData,pData);
        local_f8 = local_f8 & 0xffffffff00000000;
      }
      pFVar15 = pFVar14->aSeg + uVar2;
      if ((pFVar15->nPos != 0) || (((char)local_f0 == '\0' && (pFVar15->bDel != '\0')))) {
        iVar7 = *piVar1;
        if (iVar7 == 0 && (int)local_f8 == 0) {
          fts5WriteAppendTerm(p,&writer,nData,pData);
          iVar7 = p->rc;
          local_f8 = CONCAT44(local_f8._4_4_,1);
        }
        pBuf = &writer.writer.buf;
        if (iVar7 == 0) {
          lVar13 = pFVar14->aSeg[pFVar14->aFirst[1].iFirst].iRowid;
          if (p->pConfig->pgsz <= writer.writer.pgidx.n + writer.writer.buf.n) {
            fts5WriteFlushLeaf(p,&writer);
          }
          if (writer.bFirstRowidInPage == '\0') {
            bVar16 = true;
          }
          else {
            *(ushort *)writer.writer.buf.p =
                 (ushort)writer.writer.buf.n << 8 | (ushort)writer.writer.buf.n >> 8;
            fts5WriteDlidxAppend(p,&writer,lVar13);
            bVar16 = writer.bFirstRowidInPage == '\0';
          }
          lVar9 = 0;
          if (bVar16) {
            lVar9 = writer.iPrevRowid;
          }
          if (writer.bFirstRowidInDoclist != '\0') {
            lVar9 = 0;
          }
          sqlite3Fts5BufferAppendVarint(piVar1,pBuf,lVar13 - lVar9);
          writer._72_8_ = writer._72_8_ & 0xffffffffffff0000;
          writer.iPrevRowid = lVar13;
        }
        if (iVar6 == 1) {
          if ((pFVar15->bDel != '\0') &&
             (sqlite3Fts5BufferAppendVarint(piVar1,pBuf,0), 0 < pFVar15->nPos)) {
            sqlite3Fts5BufferAppendVarint(piVar1,pBuf,0);
          }
        }
        else {
          sqlite3Fts5BufferAppendVarint(piVar1,pBuf,(ulong)pFVar15->bDel + (long)pFVar15->nPos * 2);
          fts5ChunkIterate(p,pFVar15,&writer,fts5MergeChunkCallback);
        }
      }
      fts5MultiIterNext(p,pFVar14,0,0);
    } while (p->rc == 0);
  }
  fts5WriteFinish(p,&writer,&local_130->pgnoLast);
  pFVar14 = pIter;
  if ((p->rc == 0) && ((pIter->base).bEof == '\0')) {
    local_108.p = (u8 *)0x0;
    local_108.n = 0;
    local_108.nSpace = 0;
    iVar6 = pIter->nSeg;
    if (iVar6 < 1) {
      local_130 = (Fts5StructureSegment *)0x0;
    }
    else {
      pFVar15 = pIter->aSeg;
      local_130 = (Fts5StructureSegment *)0x0;
      lVar13 = 0;
      do {
        if (*piVar1 != 0) break;
        pFVar3 = pFVar15->pSeg;
        if (pFVar3 != (Fts5StructureSegment *)0x0) {
          if (pFVar15->pLeaf == (Fts5Data *)0x0) {
            pFVar3->pgnoFirst = 0;
            pFVar3->pgnoLast = 0;
          }
          else {
            iVar6 = pFVar15->iTermLeafOffset;
            local_cc[0] = '\0';
            local_cc[1] = '\0';
            local_cc[2] = '\0';
            local_cc[3] = '\0';
            uVar12 = (ulong)(uint)pFVar3->iSegid << 0x25;
            local_f8 = (long)pFVar15->iTermLeafPgno + uVar12;
            p_00 = fts5LeafRead(p,local_f8);
            uVar4 = local_108._8_8_;
            if (p_00 != (Fts5Data *)0x0) {
              if (p_00->szLeaf < iVar6) {
                *piVar1 = 0x10b;
              }
              else {
                local_108._8_8_ = local_108._8_8_ & 0xffffffff00000000;
                uVar5 = local_108._8_8_;
                local_108.nSpace = SUB84(uVar4,4);
                bVar16 = (uint)local_108.nSpace < (uint)p_00->nn;
                local_108._8_8_ = uVar5;
                if (bVar16) {
                  sqlite3Fts5BufferSize(piVar1,&local_108,p_00->nn);
                }
                sqlite3Fts5BufferAppendBlob(piVar1,&local_108,4,local_cc);
                sqlite3Fts5BufferAppendVarint(piVar1,&local_108,(long)(pFVar15->term).n);
                sqlite3Fts5BufferAppendBlob(piVar1,&local_108,(pFVar15->term).n,(pFVar15->term).p);
                sqlite3Fts5BufferAppendBlob(piVar1,&local_108,p_00->szLeaf - iVar6,p_00->p + iVar6);
                if (*piVar1 == 0) {
                  *(ushort *)(local_108.p + 2) = (ushort)local_108.n << 8 | (ushort)local_108.n >> 8
                  ;
                }
                sqlite3Fts5BufferAppendVarint(piVar1,&local_108,4);
                iVar6 = pFVar15->iLeafPgno;
                iVar7 = pFVar15->iTermLeafPgno;
                if (((iVar6 == pFVar15->iTermLeafPgno) &&
                    (iVar7 = iVar6, pFVar15->iEndofDoclist < p_00->szLeaf)) &&
                   (pFVar15->iPgidxOff <= p_00->nn)) {
                  sqlite3Fts5BufferAppendVarint
                            (piVar1,&local_108,
                             (long)(local_108.n + (pFVar15->iEndofDoclist - p_00->szLeaf) + -5));
                  sqlite3Fts5BufferAppendBlob
                            (piVar1,&local_108,p_00->nn - pFVar15->iPgidxOff,
                             p_00->p + pFVar15->iPgidxOff);
                  iVar7 = pFVar15->iTermLeafPgno;
                }
                iRowid = local_f8;
                pFVar15->pSeg->pgnoFirst = iVar7;
                fts5DataDelete(p,uVar12 | 1,local_f8);
                local_130 = (Fts5StructureSegment *)local_108.p;
                fts5DataWrite(p,iRowid,local_108.p,local_108.n);
              }
              sqlite3_free(p_00);
            }
            iVar6 = pFVar14->nSeg;
          }
        }
        lVar13 = lVar13 + 1;
        pFVar15 = pFVar15 + 1;
      } while (lVar13 < iVar6);
    }
    sqlite3_free(local_130);
    pFVar11->nMerge = nSegment;
    pFVar14 = pIter;
  }
  else {
    if (0 < (int)nSegment) {
      ppStmt = &p->pIdxDeleter;
      lVar13 = 0;
      do {
        iVar6 = *(int *)((long)&pFVar11->aSeg->iSegid + lVar13);
        fts5DataDelete(p,(long)iVar6 << 0x25,((ulong)(iVar6 + 1) << 0x25) + -1);
        if (p->pIdxDeleter == (sqlite3_stmt *)0x0) {
          zSql = sqlite3_mprintf("DELETE FROM \'%q\'.\'%q_idx\' WHERE segid=?",p->pConfig->zDb,
                                 p->pConfig->zName);
          fts5IndexPrepareStmt(p,ppStmt,zSql);
        }
        if (*piVar1 == 0) {
          sqlite3_bind_int64(*ppStmt,1,(long)iVar6);
          sqlite3_step(*ppStmt);
          iVar6 = sqlite3_reset(*ppStmt);
          *piVar1 = iVar6;
        }
        lVar13 = lVar13 + 0xc;
      } while ((ulong)nSegment * 0xc != lVar13);
    }
    iVar6 = pFVar11->nSeg - nSegment;
    uVar10 = nSegment;
    if (iVar6 != 0) {
      memmove(pFVar11->aSeg,pFVar11->aSeg + (int)nSegment,(long)(iVar6 * 0xc));
      uVar10 = pFVar11->nSeg;
    }
    iVar6 = local_e8->nSegment - nSegment;
    local_e8->nSegment = iVar6;
    pFVar11->nSeg = uVar10 - nSegment;
    pFVar11->nMerge = 0;
    if (local_130->pgnoLast == 0) {
      local_b0->nSeg = local_b0->nSeg + -1;
      local_e8->nSegment = iVar6 + -1;
    }
  }
  piVar1 = local_d8;
  fts5MultiIterFree(pFVar14);
  sqlite3_free(local_c8.p);
  if (piVar1 != (int *)0x0) {
    *piVar1 = *piVar1 - writer.nLeafWritten;
  }
  return;
}

Assistant:

static void fts5IndexMergeLevel(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Structure **ppStruct,       /* IN/OUT: Stucture of index */
  int iLvl,                       /* Level to read input from */
  int *pnRem                      /* Write up to this many output leaves */
){
  Fts5Structure *pStruct = *ppStruct;
  Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
  Fts5StructureLevel *pLvlOut;
  Fts5Iter *pIter = 0;       /* Iterator to read input data */
  int nRem = pnRem ? *pnRem : 0;  /* Output leaf pages left to write */
  int nInput;                     /* Number of input segments */
  Fts5SegWriter writer;           /* Writer object */
  Fts5StructureSegment *pSeg;     /* Output segment */
  Fts5Buffer term;
  int bOldest;                    /* True if the output segment is the oldest */
  int eDetail = p->pConfig->eDetail;
  const int flags = FTS5INDEX_QUERY_NOOUTPUT;
  int bTermWritten = 0;           /* True if current term already output */

  assert( iLvl<pStruct->nLevel );
  assert( pLvl->nMerge<=pLvl->nSeg );

  memset(&writer, 0, sizeof(Fts5SegWriter));
  memset(&term, 0, sizeof(Fts5Buffer));
  if( pLvl->nMerge ){
    pLvlOut = &pStruct->aLevel[iLvl+1];
    assert( pLvlOut->nSeg>0 );
    nInput = pLvl->nMerge;
    pSeg = &pLvlOut->aSeg[pLvlOut->nSeg-1];

    fts5WriteInit(p, &writer, pSeg->iSegid);
    writer.writer.pgno = pSeg->pgnoLast+1;
    writer.iBtPage = 0;
  }else{
    int iSegid = fts5AllocateSegid(p, pStruct);

    /* Extend the Fts5Structure object as required to ensure the output
    ** segment exists. */
    if( iLvl==pStruct->nLevel-1 ){
      fts5StructureAddLevel(&p->rc, ppStruct);
      pStruct = *ppStruct;
    }
    fts5StructureExtendLevel(&p->rc, pStruct, iLvl+1, 1, 0);
    if( p->rc ) return;
    pLvl = &pStruct->aLevel[iLvl];
    pLvlOut = &pStruct->aLevel[iLvl+1];

    fts5WriteInit(p, &writer, iSegid);

    /* Add the new segment to the output level */
    pSeg = &pLvlOut->aSeg[pLvlOut->nSeg];
    pLvlOut->nSeg++;
    pSeg->pgnoFirst = 1;
    pSeg->iSegid = iSegid;
    pStruct->nSegment++;

    /* Read input from all segments in the input level */
    nInput = pLvl->nSeg;
  }
  bOldest = (pLvlOut->nSeg==1 && pStruct->nLevel==iLvl+2);

  assert( iLvl>=0 );
  for(fts5MultiIterNew(p, pStruct, flags, 0, 0, 0, iLvl, nInput, &pIter);
      fts5MultiIterEof(p, pIter)==0;
      fts5MultiIterNext(p, pIter, 0, 0)
  ){
    Fts5SegIter *pSegIter = &pIter->aSeg[ pIter->aFirst[1].iFirst ];
    int nPos;                     /* position-list size field value */
    int nTerm;
    const u8 *pTerm;

    pTerm = fts5MultiIterTerm(pIter, &nTerm);
    if( nTerm!=term.n || fts5Memcmp(pTerm, term.p, nTerm) ){
      if( pnRem && writer.nLeafWritten>nRem ){
        break;
      }
      fts5BufferSet(&p->rc, &term, nTerm, pTerm);
      bTermWritten =0;
    }

    /* Check for key annihilation. */
    if( pSegIter->nPos==0 && (bOldest || pSegIter->bDel==0) ) continue;

    if( p->rc==SQLITE_OK && bTermWritten==0 ){
      /* This is a new term. Append a term to the output segment. */
      fts5WriteAppendTerm(p, &writer, nTerm, pTerm);
      bTermWritten = 1;
    }

    /* Append the rowid to the output */
    /* WRITEPOSLISTSIZE */
    fts5WriteAppendRowid(p, &writer, fts5MultiIterRowid(pIter));

    if( eDetail==FTS5_DETAIL_NONE ){
      if( pSegIter->bDel ){
        fts5BufferAppendVarint(&p->rc, &writer.writer.buf, 0);
        if( pSegIter->nPos>0 ){
          fts5BufferAppendVarint(&p->rc, &writer.writer.buf, 0);
        }
      }
    }else{
      /* Append the position-list data to the output */
      nPos = pSegIter->nPos*2 + pSegIter->bDel;
      fts5BufferAppendVarint(&p->rc, &writer.writer.buf, nPos);
      fts5ChunkIterate(p, pSegIter, (void*)&writer, fts5MergeChunkCallback);
    }
  }

  /* Flush the last leaf page to disk. Set the output segment b-tree height
  ** and last leaf page number at the same time.  */
  fts5WriteFinish(p, &writer, &pSeg->pgnoLast);

  if( fts5MultiIterEof(p, pIter) ){
    int i;

    /* Remove the redundant segments from the %_data table */
    for(i=0; i<nInput; i++){
      fts5DataRemoveSegment(p, pLvl->aSeg[i].iSegid);
    }

    /* Remove the redundant segments from the input level */
    if( pLvl->nSeg!=nInput ){
      int nMove = (pLvl->nSeg - nInput) * sizeof(Fts5StructureSegment);
      memmove(pLvl->aSeg, &pLvl->aSeg[nInput], nMove);
    }
    pStruct->nSegment -= nInput;
    pLvl->nSeg -= nInput;
    pLvl->nMerge = 0;
    if( pSeg->pgnoLast==0 ){
      pLvlOut->nSeg--;
      pStruct->nSegment--;
    }
  }else{
    assert( pSeg->pgnoLast>0 );
    fts5TrimSegments(p, pIter);
    pLvl->nMerge = nInput;
  }

  fts5MultiIterFree(pIter);
  fts5BufferFree(&term);
  if( pnRem ) *pnRem -= writer.nLeafWritten;
}